

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::BinsSelectConditionExprSyntax::setChild
          (BinsSelectConditionExprSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_008c0674 + *(int *)(&DAT_008c0674 + index * 4)))();
  return;
}

Assistant:

void BinsSelectConditionExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: binsof = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: intersects = child.node() ? &child.node()->as<IntersectClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}